

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O0

_Bool reusable_node_descend(ReusableNode *self)

{
  uint uVar1;
  Subtree self_00;
  SubtreeHeapData *pSVar2;
  uint32_t uVar3;
  Subtree *pSVar4;
  StackEntry last_entry;
  ReusableNode *self_local;
  
  if ((self->stack).size <= (self->stack).size - 1) {
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x48,"_Bool reusable_node_descend(ReusableNode *)");
  }
  pSVar4 = &(self->stack).contents[(self->stack).size - 1].tree;
  self_00 = *pSVar4;
  pSVar2 = pSVar4[1].ptr;
  uVar3 = ts_subtree_child_count(self_00);
  if (uVar3 != 0) {
    array__grow((VoidArray *)self,0x10);
    uVar1 = (self->stack).size;
    (self->stack).size = uVar1 + 1;
    pSVar4 = &(self->stack).contents[uVar1].tree;
    *pSVar4 = *((self_00.ptr)->field_17).field_0.children;
    pSVar4[1].ptr = (SubtreeHeapData *)((ulong)pSVar2 & 0xffffffff00000000);
  }
  return uVar3 != 0;
}

Assistant:

static inline bool reusable_node_descend(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  if (ts_subtree_child_count(last_entry.tree) > 0) {
    array_push(&self->stack, ((StackEntry) {
      .tree = last_entry.tree.ptr->children[0],
      .child_index = 0,
      .byte_offset = last_entry.byte_offset,
    }));
    return true;
  } else {
    return false;
  }
}